

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proitems.cpp
# Opt level: O0

QString * __thiscall ProString::toQString(ProString *this,QString *tmp)

{
  QString *in_RSI;
  longlong in_RDI;
  long in_FS_OFFSET;
  QString *in_stack_ffffffffffffffb8;
  QString *this_00;
  QString local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &local_20;
  QString::mid((longlong)this_00,in_RDI);
  QString::operator=(this_00,in_stack_ffffffffffffffb8);
  QString::~QString((QString *)0x111615);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RSI;
  }
  __stack_chk_fail();
}

Assistant:

QString &ProString::toQString(QString &tmp) const
{
    tmp = m_string.mid(m_offset, m_length);
    return tmp;
}